

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isStruct(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *in_RDI;
  Type *ct;
  bool local_1;
  
  pTVar2 = getCanonicalType(in_RDI);
  SVar1 = (pTVar2->super_Symbol).kind;
  local_1 = SVar1 == PackedStructType || SVar1 == UnpackedStructType;
  return local_1;
}

Assistant:

bool Type::isStruct() const {
    const Type& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedStructType:
        case SymbolKind::UnpackedStructType:
            return true;
        default:
            return false;
    }
}